

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

int32_t __thiscall cppnet::BufferBlock::MoveWritePt(BufferBlock *this,int32_t len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t left_1;
  size_t size_3;
  size_t size_end_1;
  size_t size_start_1;
  size_t size_2;
  size_t left;
  size_t size_1;
  size_t size_end;
  size_t size_start;
  size_t size;
  int32_t len_local;
  BufferBlock *this_local;
  
  if (this->_buffer_start == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (len < 1) {
    this_local._4_4_ = -len;
    if (this->_read < this->_write) {
      iVar1 = (int)this->_write - (int)this->_read;
      if (this_local._4_4_ < iVar1) {
        this->_write = this->_write + -(long)this_local._4_4_;
      }
      else {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])();
        this_local._4_4_ = iVar1;
      }
    }
    else if (((this->_can_read & 1U) == 0) && (this->_read == this->_write)) {
      this_local._4_4_ = 0;
    }
    else {
      lVar3 = (long)this->_write - (long)this->_buffer_start;
      iVar1 = (int)lVar3;
      iVar2 = iVar1 + ((int)this->_buffer_end - (int)this->_read);
      if (this_local._4_4_ < iVar2) {
        if (iVar1 < this_local._4_4_) {
          this->_write = this->_buffer_end + -(this_local._4_4_ - lVar3);
        }
        else {
          this->_write = this->_write + -(long)this_local._4_4_;
        }
      }
      else {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])();
        this_local._4_4_ = iVar2;
      }
    }
  }
  else if (this->_write < this->_read) {
    this_local._4_4_ = (int)this->_read - (int)this->_write;
    if (len < this_local._4_4_) {
      this->_write = this->_write + len;
      this_local._4_4_ = len;
    }
    else {
      this->_write = this->_read;
      this->_can_read = true;
    }
  }
  else if (((this->_can_read & 1U) == 0) || (this->_read != this->_write)) {
    lVar3 = (long)this->_buffer_end - (long)this->_write;
    iVar1 = (int)lVar3;
    this_local._4_4_ = ((int)this->_read - (int)this->_buffer_start) + iVar1;
    if (len < this_local._4_4_) {
      if (iVar1 < len) {
        this->_write = this->_buffer_start + (len - lVar3);
        this_local._4_4_ = len;
      }
      else {
        this->_write = this->_write + len;
        this_local._4_4_ = len;
      }
    }
    else {
      this->_write = this->_read;
      this->_can_read = true;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t BufferBlock::MoveWritePt(int32_t len) {
    if (!_buffer_start) {
        return 0;
    }

    if (len > 0) {
        /*s-----------w-----r-------------e*/
        if (_write < _read) {
            size_t size = _read - _write;
            // all buffer will be used
            if ((int32_t)size <= len) {
                _write = _read;
                _can_read = true;
                return (int32_t)size;

            // part of buffer will be used
            } else {
                _write += len;
                return len;
            }

        /*s-----------r-----w-------------e*/
        /*s-----------rw------------------e*/
        } else {
            if(_can_read && _read == _write) {
                return 0;
            }
            size_t size_start = _read - _buffer_start;
            size_t size_end = _buffer_end - _write;
            size_t size =  size_start + size_end;

            // all buffer will be used
            if ((int32_t)size <= len) {
                _write = _read;
                _can_read = true;
                return (int32_t)size;

            // part of buffer will be used
            } else {
                if (len <= (int32_t)size_end) {
                    _write += len;
                    return len;

                } else {
                    size_t left = len - size_end;
                    _write = _buffer_start + left;
                    return len;
                }
            }
        }

    } else {
        len = -len;
        /*s-----------r-----w-------------e*/
        if (_read < _write) {
            size_t size = _write - _read;
            // rewrite all buffer
            if ((int32_t)size <= len) {
                Clear();
                return (int32_t)size;

            // only rewrite part of buffer
            } else {
                _write -= len;
                return len;
            }
        
        /*s-----------w-----r-------------e*/
        /*s-----------wr------------------e*/
        } else {
            if(!_can_read && _read == _write) {
                return 0;
            }
            size_t size_start = _write - _buffer_start;
            size_t size_end = _buffer_end - _read;
            size_t size =  size_start + size_end;
            // rewrite all buffer
            if ((int32_t)size <= len) {
                Clear();
                return (int32_t)size;

            // only rewrite part of buffer
            } else {
                if (len <= (int32_t)size_start) {
                    _write -= len;
                    return len;

                } else {
                    size_t left = len - size_start;
                    _write = _buffer_end - left;
                    return len;
                }
            }
        }
    }
}